

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_m16adds64_q(DisasContext_conflict14 *ctx,TCGv_i32 rl,TCGv_i32 rh,TCGv_i32 arg1_low,
                    TCGv_i32 arg1_high,TCGv_i32 arg2,TCGv_i32 arg3,uint32_t n)

{
  TCGContext_conflict9 *tcg_ctx_00;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i64 dest;
  TCGv_i64 ret_01;
  TCGv_i64 t2;
  TCGv_i64 t1;
  TCGv_i32 temp2;
  TCGv_i32 temp;
  TCGContext_conflict9 *tcg_ctx;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_high_local;
  TCGv_i32 arg1_low_local;
  TCGv_i32 rh_local;
  TCGv_i32 rl_local;
  DisasContext_conflict14 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx_00);
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  dest = tcg_temp_new_i64(tcg_ctx_00);
  ret_01 = tcg_temp_new_i64(tcg_ctx_00);
  if (n == 0) {
    tcg_gen_mul_i32(tcg_ctx_00,ret,arg2,arg3);
  }
  else {
    tcg_gen_mul_i32(tcg_ctx_00,ret,arg2,arg3);
    tcg_gen_shli_i32_tricore(tcg_ctx_00,ret,ret,1);
    tcg_gen_setcondi_i32_tricore(tcg_ctx_00,TCG_COND_EQ,ret_00,ret,-0x80000000);
    tcg_gen_sub_i32(tcg_ctx_00,ret,ret,ret_00);
  }
  tcg_gen_ext_i32_i64_tricore(tcg_ctx_00,ret_01,ret);
  tcg_gen_shli_i64_tricore(tcg_ctx_00,ret_01,ret_01,0x10);
  tcg_gen_concat_i32_i64_tricore(tcg_ctx_00,dest,arg1_low,arg1_high);
  gen_helper_add64_ssov(tcg_ctx_00,dest,tcg_ctx_00->cpu_env,dest,ret_01);
  tcg_gen_extr_i64_i32_tricore(tcg_ctx_00,rl,rh,dest);
  tcg_temp_free_i32(tcg_ctx_00,ret);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  tcg_temp_free_i64(tcg_ctx_00,dest);
  tcg_temp_free_i64(tcg_ctx_00,ret_01);
  return;
}

Assistant:

static inline void
gen_m16adds64_q(DisasContext *ctx, TCGv rl, TCGv rh, TCGv arg1_low, TCGv arg1_high, TCGv arg2,
               TCGv arg3, uint32_t n)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv temp = tcg_temp_new(tcg_ctx);
    TCGv temp2 = tcg_temp_new(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);

    if (n == 0) {
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
    } else { /* n is expected to be 1 */
        tcg_gen_mul_tl(tcg_ctx, temp, arg2, arg3);
        tcg_gen_shli_tl(tcg_ctx, temp, temp, 1);
        /* catch special case r1 = r2 = 0x8000 */
        tcg_gen_setcondi_tl(tcg_ctx, TCG_COND_EQ, temp2, temp, 0x80000000);
        tcg_gen_sub_tl(tcg_ctx, temp, temp, temp2);
    }
    tcg_gen_ext_i32_i64(tcg_ctx, t2, temp);
    tcg_gen_shli_i64(tcg_ctx, t2, t2, 16);
    tcg_gen_concat_i32_i64(tcg_ctx, t1, arg1_low, arg1_high);

    gen_helper_add64_ssov(tcg_ctx, t1, tcg_ctx->cpu_env, t1, t2);
    tcg_gen_extr_i64_i32(tcg_ctx, rl, rh, t1);

    tcg_temp_free(tcg_ctx, temp);
    tcg_temp_free(tcg_ctx, temp2);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t2);
}